

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall DynamicGraph::visualize(DynamicGraph *this,ostream *strm)

{
  pointer pbVar1;
  type_conflict tVar2;
  reference pvVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  unsigned_long uVar7;
  size_type sVar8;
  reference local_e8;
  undefined1 local_d0 [8];
  Edge e;
  Vertex v;
  Vertex u;
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>_>
  local_98;
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  local_88;
  EdgeIterator ei_end;
  EdgeIterator ei;
  int local_54;
  int local_50;
  int i_3;
  int i_2;
  int i_1;
  int i;
  allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_31;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subgraphs;
  ostream *strm_local;
  DynamicGraph *this_local;
  
  sVar5 = this->nextComponent;
  subgraphs.
  super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)strm;
  std::
  allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator(&local_31);
  std::
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30,sVar5,&local_31);
  std::
  allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator(&local_31);
  for (i_2 = 0; (ulong)(long)i_2 < this->nextComponent; i_2 = i_2 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_30,(long)i_2);
    poVar4 = std::operator<<((ostream *)pvVar3,"  subgraph cluster");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,i_2);
    poVar4 = std::operator<<(poVar4," { label = \"Component ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,i_2 + 1);
    std::operator<<(poVar4,"\" ");
  }
  i_3 = 0;
  while( true ) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->components);
    if (sVar5 <= (ulong)(long)i_3) break;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->components,(long)i_3);
    pvVar3 = std::
             vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_30,*pvVar6 - 1);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar3,i_3);
    std::operator<<(poVar4,"; ");
    i_3 = i_3 + 1;
  }
  for (local_50 = 0; (ulong)(long)local_50 < this->nextComponent; local_50 = local_50 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_30,(long)local_50);
    std::operator<<((ostream *)pvVar3," }\n");
  }
  poVar4 = std::operator<<((ostream *)
                           subgraphs.
                           super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"graph G {");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)
                           subgraphs.
                           super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"  size=\"5,3\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)
                           subgraphs.
                           super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"  ratio=\"fill\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)
                           subgraphs.
                           super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "  edge[style=\"bold\"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)
                           subgraphs.
                           super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "  node[shape=\"circle\"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_54 = 0;
      pbVar1 = subgraphs.
               super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
      (ulong)(long)local_54 < this->nextComponent; local_54 = local_54 + 1) {
    std::
    vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30,(long)local_54);
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)pbVar1,(string *)&ei);
    std::__cxx11::string::~string((string *)&ei);
  }
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::undirected_edge_iter(&ei_end);
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::undirected_edge_iter(&local_88);
  local_98 = boost::
             edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
                       ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                         *)this);
  boost::tuples::
  tie<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>>
            ((tuples *)&u,&ei_end,&local_88);
  boost::tuples::
  tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&u,&local_98);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&ei_end,
                       (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&local_88);
    if (!tVar2) break;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator*((reference *)local_d0,
                (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                 *)&ei_end);
    uVar7 = boost::
            source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                      ((edge_base<boost::undirected_tag,_unsigned_long> *)local_d0,
                       &this->super_UndirectedGraph);
    e.m_eproperty =
         (property_type *)
         boost::
         target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                   ((edge_base<boost::undirected_tag,_unsigned_long> *)local_d0,
                    &this->super_UndirectedGraph);
    poVar4 = std::operator<<((ostream *)
                             subgraphs.
                             super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"  ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar7);
    poVar4 = std::operator<<(poVar4," -- ");
    std::ostream::operator<<(poVar4,(ulong)e.m_eproperty);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator*(&local_e8,
                (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                 *)&ei_end);
    sVar8 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::count(&this->virtualEdges,&local_e8);
    if (sVar8 != 0) {
      std::operator<<((ostream *)
                      subgraphs.
                      super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage," [style=dotted]");
    }
    poVar4 = std::operator<<((ostream *)
                             subgraphs.
                             super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,";");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                  *)&ei_end);
  }
  poVar4 = std::operator<<((ostream *)
                           subgraphs.
                           super__Vector_base<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"}");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

void DynamicGraph::visualize(std::ostream &strm) const
{
    // Creating components streams
    std::vector<std::ostringstream> subgraphs(this->nextComponent);
    for(int i = 0; i<this->nextComponent; ++i) {
        subgraphs[i] << "  subgraph cluster" << i << " { label = \"Component " << i+1 << "\" ";
    }
    for(int i = 0; i<this->components.size(); ++i) {
        subgraphs[components[i]-1] << i << "; ";
    }
    for(int i = 0; i<this->nextComponent; ++i) {
        subgraphs[i] << " }\n";
    }

    // Printing graph style
    strm << "graph G {" << std::endl;
    strm << "  size=\"5,3\"" << std::endl;
    strm << "  ratio=\"fill\"" << std::endl;
    strm << "  edge[style=\"bold\"]" << std::endl;
    strm << "  node[shape=\"circle\"]" << std::endl;
    // Print subgraphs by vertices
    for(int i = 0; i<this->nextComponent; ++i) {
        strm  << subgraphs[i].str();
    }
    // Print edges
    EdgeIterator ei, ei_end;
    for (tie(ei, ei_end) = edges(*this); ei != ei_end; ++ei) {
        Vertex u,v;
        Edge e = *ei;
        u = source(e, *this);
        v = target(e, *this);
        strm << "  " << u << " -- " << v;
        if (virtualEdges.count(*ei)) strm << " [style=dotted]";
        strm << ";" << std::endl;
    }

    strm << "}" << std::endl;
}